

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O1

int pybind11_getbuffer(PyObject *obj,Py_buffer *view,int flags)

{
  Py_ssize_t PVar1;
  long *plVar2;
  long *plVar3;
  tuple_iterator tVar4;
  type_info *ptVar5;
  buffer_info *this;
  long lVar6;
  char *pcVar7;
  long *plVar8;
  sequence_fast_readonly sVar9;
  handle local_38;
  
  local_38.m_ptr = obj->ob_type->tp_mro;
  pybind11::handle::inc_ref(&local_38);
  sVar9.ptr = (PyObject **)&local_38.m_ptr[1].ob_type;
  if (((local_38.m_ptr)->ob_type->tp_flags & 0x2000000) != 0) {
    sVar9.ptr = (PyObject **)*sVar9.ptr;
  }
  tVar4 = pybind11::tuple::end((tuple *)&local_38);
  if ((sequence_fast_readonly)sVar9.ptr == tVar4.super_sequence_fast_readonly.ptr) {
    ptVar5 = (type_info *)0x0;
  }
  else {
    do {
      ptVar5 = pybind11::detail::get_type_info((PyTypeObject *)*sVar9.ptr);
      if ((ptVar5 != (type_info *)0x0) &&
         (ptVar5->get_buffer != (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0)) break;
      sVar9.ptr = sVar9.ptr + 1;
    } while ((sequence_fast_readonly)sVar9.ptr != tVar4.super_sequence_fast_readonly.ptr);
  }
  pybind11::handle::dec_ref(&local_38);
  if (((view == (Py_buffer *)0x0) || (ptVar5 == (type_info *)0x0)) ||
     (ptVar5->get_buffer == (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0)) {
    if (view != (Py_buffer *)0x0) {
      view->obj = (PyObject *)0x0;
    }
    pcVar7 = "pybind11_getbuffer(): Internal error";
  }
  else {
    view->suboffsets = (Py_ssize_t *)0x0;
    view->internal = (void *)0x0;
    view->shape = (Py_ssize_t *)0x0;
    view->strides = (Py_ssize_t *)0x0;
    view->readonly = 0;
    view->ndim = 0;
    view->format = (char *)0x0;
    view->len = 0;
    view->itemsize = 0;
    view->buf = (void *)0x0;
    view->obj = (PyObject *)0x0;
    this = (*ptVar5->get_buffer)(obj,ptVar5->get_buffer_data);
    if (((flags & 1U) == 0) || (this[0x70] != (buffer_info)0x1)) {
      view->obj = obj;
      view->ndim = 1;
      view->internal = this;
      view->buf = *(void **)this;
      PVar1 = *(Py_ssize_t *)(this + 8);
      view->itemsize = PVar1;
      view->len = PVar1;
      plVar2 = *(long **)(this + 0x40);
      plVar3 = *(long **)(this + 0x48);
      if (plVar2 != plVar3) {
        lVar6 = view->len;
        plVar8 = plVar2;
        do {
          lVar6 = lVar6 * *plVar8;
          view->len = lVar6;
          plVar8 = plVar8 + 1;
        } while (plVar8 != plVar3);
      }
      view->readonly = (uint)(byte)this[0x70];
      if ((flags & 4U) != 0) {
        view->format = *(char **)(this + 0x18);
      }
      if ((~flags & 0x18U) == 0) {
        view->ndim = *(int *)(this + 0x38);
        view->strides = *(Py_ssize_t **)(this + 0x58);
        view->shape = plVar2;
      }
      obj->ob_refcnt = obj->ob_refcnt + 1;
      return 0;
    }
    if (this != (buffer_info *)0x0) {
      pybind11::buffer_info::~buffer_info(this);
      operator_delete(this,0x88);
    }
    pcVar7 = "Writable buffer requested for readonly storage";
  }
  PyErr_SetString(_PyExc_BufferError,pcVar7);
  return -1;
}

Assistant:

inline int pybind11_getbuffer(PyObject *obj, Py_buffer *view, int flags) {
    // Look for a `get_buffer` implementation in this type's info or any bases (following MRO).
    type_info *tinfo = nullptr;
    for (auto type : reinterpret_borrow<tuple>(Py_TYPE(obj)->tp_mro)) {
        tinfo = get_type_info((PyTypeObject *) type.ptr());
        if (tinfo && tinfo->get_buffer) {
            break;
        }
    }
    if (view == nullptr || !tinfo || !tinfo->get_buffer) {
        if (view) {
            view->obj = nullptr;
        }
        set_error(PyExc_BufferError, "pybind11_getbuffer(): Internal error");
        return -1;
    }
    std::memset(view, 0, sizeof(Py_buffer));
    buffer_info *info = tinfo->get_buffer(obj, tinfo->get_buffer_data);
    if ((flags & PyBUF_WRITABLE) == PyBUF_WRITABLE && info->readonly) {
        delete info;
        // view->obj = nullptr;  // Was just memset to 0, so not necessary
        set_error(PyExc_BufferError, "Writable buffer requested for readonly storage");
        return -1;
    }
    view->obj = obj;
    view->ndim = 1;
    view->internal = info;
    view->buf = info->ptr;
    view->itemsize = info->itemsize;
    view->len = view->itemsize;
    for (auto s : info->shape) {
        view->len *= s;
    }
    view->readonly = static_cast<int>(info->readonly);
    if ((flags & PyBUF_FORMAT) == PyBUF_FORMAT) {
        view->format = const_cast<char *>(info->format.c_str());
    }
    if ((flags & PyBUF_STRIDES) == PyBUF_STRIDES) {
        view->ndim = (int) info->ndim;
        view->strides = info->strides.data();
        view->shape = info->shape.data();
    }
    Py_INCREF(view->obj);
    return 0;
}